

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image_writer.cpp
# Opt level: O2

void errorFn(png_structp png_ptr,png_const_charp error_msg)

{
  string *this;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = (string *)png_get_error_ptr();
  std::__cxx11::string::string((string *)&local_58,"libpng error: ",&local_59);
  std::operator+(&local_38,&local_58,error_msg);
  std::__cxx11::string::operator=(this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

static void errorFn(png_structp png_ptr, png_const_charp error_msg)
{
    auto* errorStr = static_cast<std::string*>(png_get_error_ptr(png_ptr));
    *errorStr = std::string("libpng error: ") + error_msg;
}